

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDARootInit(void *ida_mem,int nrtfn,IDARootFn g)

{
  sunrealtype *psVar1;
  int *piVar2;
  IDARootFn in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  int nrt;
  int i;
  IDAMem IDA_mem;
  int local_34;
  int local_2c;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x8d2,"IDARootInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    local_34 = in_ESI;
    if (in_ESI < 0) {
      local_34 = 0;
    }
    if ((local_34 != in_RDI->ida_nrtfn) && (0 < in_RDI->ida_nrtfn)) {
      free(in_RDI->ida_glo);
      in_RDI->ida_glo = (sunrealtype *)0x0;
      free(in_RDI->ida_ghi);
      in_RDI->ida_ghi = (sunrealtype *)0x0;
      free(in_RDI->ida_grout);
      in_RDI->ida_grout = (sunrealtype *)0x0;
      free(in_RDI->ida_iroots);
      in_RDI->ida_iroots = (int *)0x0;
      free(in_RDI->ida_rootdir);
      in_RDI->ida_rootdir = (int *)0x0;
      free(in_RDI->ida_gactive);
      in_RDI->ida_gactive = (int *)0x0;
      in_RDI->ida_lrw = in_RDI->ida_lrw - (long)(in_RDI->ida_nrtfn * 3);
      in_RDI->ida_liw = in_RDI->ida_liw - (long)(in_RDI->ida_nrtfn * 3);
    }
    if (local_34 == 0) {
      in_RDI->ida_nrtfn = 0;
      in_RDI->ida_gfun = (IDARootFn)0x0;
      local_4 = 0;
    }
    else if (local_34 == in_RDI->ida_nrtfn) {
      if (in_RDX == in_RDI->ida_gfun) {
        local_4 = 0;
      }
      else if (in_RDX == (IDARootFn)0x0) {
        free(in_RDI->ida_glo);
        in_RDI->ida_glo = (sunrealtype *)0x0;
        free(in_RDI->ida_ghi);
        in_RDI->ida_ghi = (sunrealtype *)0x0;
        free(in_RDI->ida_grout);
        in_RDI->ida_grout = (sunrealtype *)0x0;
        free(in_RDI->ida_iroots);
        in_RDI->ida_iroots = (int *)0x0;
        free(in_RDI->ida_rootdir);
        in_RDI->ida_rootdir = (int *)0x0;
        free(in_RDI->ida_gactive);
        in_RDI->ida_gactive = (int *)0x0;
        in_RDI->ida_lrw = in_RDI->ida_lrw - (long)(local_34 * 3);
        in_RDI->ida_liw = in_RDI->ida_liw - (long)(local_34 * 3);
        IDAProcessError(in_RDI,-0x16,0x916,"IDARootInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                        ,"g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->ida_gfun = in_RDX;
        local_4 = 0;
      }
    }
    else {
      in_RDI->ida_nrtfn = local_34;
      if (in_RDX == (IDARootFn)0x0) {
        IDAProcessError(in_RDI,-0x16,0x92d,"IDARootInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                        ,"g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->ida_gfun = in_RDX;
        in_RDI->ida_glo = (sunrealtype *)0x0;
        psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
        in_RDI->ida_glo = psVar1;
        if (in_RDI->ida_glo == (sunrealtype *)0x0) {
          IDAProcessError(in_RDI,-0x15,0x939,"IDARootInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                          ,"A memory request failed.");
          local_4 = -0x15;
        }
        else {
          in_RDI->ida_ghi = (sunrealtype *)0x0;
          psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
          in_RDI->ida_ghi = psVar1;
          if (in_RDI->ida_ghi == (sunrealtype *)0x0) {
            free(in_RDI->ida_glo);
            in_RDI->ida_glo = (sunrealtype *)0x0;
            IDAProcessError(in_RDI,-0x15,0x945,"IDARootInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                            ,"A memory request failed.");
            local_4 = -0x15;
          }
          else {
            in_RDI->ida_grout = (sunrealtype *)0x0;
            psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
            in_RDI->ida_grout = psVar1;
            if (in_RDI->ida_grout == (sunrealtype *)0x0) {
              free(in_RDI->ida_glo);
              in_RDI->ida_glo = (sunrealtype *)0x0;
              free(in_RDI->ida_ghi);
              in_RDI->ida_ghi = (sunrealtype *)0x0;
              IDAProcessError(in_RDI,-0x15,0x953,"IDARootInit",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                              ,"A memory request failed.");
              local_4 = -0x15;
            }
            else {
              in_RDI->ida_iroots = (int *)0x0;
              piVar2 = (int *)malloc((long)local_34 << 2);
              in_RDI->ida_iroots = piVar2;
              if (in_RDI->ida_iroots == (int *)0x0) {
                free(in_RDI->ida_glo);
                in_RDI->ida_glo = (sunrealtype *)0x0;
                free(in_RDI->ida_ghi);
                in_RDI->ida_ghi = (sunrealtype *)0x0;
                free(in_RDI->ida_grout);
                in_RDI->ida_grout = (sunrealtype *)0x0;
                IDAProcessError(in_RDI,-0x15,0x963,"IDARootInit",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                                ,"A memory request failed.");
                local_4 = -0x15;
              }
              else {
                in_RDI->ida_rootdir = (int *)0x0;
                piVar2 = (int *)malloc((long)local_34 << 2);
                in_RDI->ida_rootdir = piVar2;
                if (in_RDI->ida_rootdir == (int *)0x0) {
                  free(in_RDI->ida_glo);
                  in_RDI->ida_glo = (sunrealtype *)0x0;
                  free(in_RDI->ida_ghi);
                  in_RDI->ida_ghi = (sunrealtype *)0x0;
                  free(in_RDI->ida_grout);
                  in_RDI->ida_grout = (sunrealtype *)0x0;
                  free(in_RDI->ida_iroots);
                  in_RDI->ida_iroots = (int *)0x0;
                  IDAProcessError(in_RDI,-0x15,0x975,"IDARootInit",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                                  ,"A memory request failed.");
                  local_4 = -0x15;
                }
                else {
                  in_RDI->ida_gactive = (int *)0x0;
                  piVar2 = (int *)malloc((long)local_34 << 2);
                  in_RDI->ida_gactive = piVar2;
                  if (in_RDI->ida_gactive == (int *)0x0) {
                    free(in_RDI->ida_glo);
                    in_RDI->ida_glo = (sunrealtype *)0x0;
                    free(in_RDI->ida_ghi);
                    in_RDI->ida_ghi = (sunrealtype *)0x0;
                    free(in_RDI->ida_grout);
                    in_RDI->ida_grout = (sunrealtype *)0x0;
                    free(in_RDI->ida_iroots);
                    in_RDI->ida_iroots = (int *)0x0;
                    free(in_RDI->ida_rootdir);
                    in_RDI->ida_rootdir = (int *)0x0;
                    IDAProcessError(in_RDI,-0x15,0x989,"IDARootInit",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                                    ,"A memory request failed.");
                    local_4 = -0x15;
                  }
                  else {
                    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
                      in_RDI->ida_rootdir[local_2c] = 0;
                    }
                    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
                      in_RDI->ida_gactive[local_2c] = 1;
                    }
                    in_RDI->ida_lrw = (long)(local_34 * 3) + in_RDI->ida_lrw;
                    in_RDI->ida_liw = (long)(local_34 * 3) + in_RDI->ida_liw;
                    local_4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int IDARootInit(void* ida_mem, int nrtfn, IDARootFn g)
{
  IDAMem IDA_mem;
  int i, nrt;

  /* Check ida_mem pointer */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If rerunning IDARootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != IDA_mem->ida_nrtfn) && (IDA_mem->ida_nrtfn > 0))
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    free(IDA_mem->ida_gactive);
    IDA_mem->ida_gactive = NULL;

    IDA_mem->ida_lrw -= 3 * (IDA_mem->ida_nrtfn);
    IDA_mem->ida_liw -= 3 * (IDA_mem->ida_nrtfn);
  }

  /* If IDARootInit() was called with nrtfn == 0, then set ida_nrtfn to
     zero and ida_gfun to NULL before returning */
  if (nrt == 0)
  {
    IDA_mem->ida_nrtfn = nrt;
    IDA_mem->ida_gfun  = NULL;
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_SUCCESS);
  }

  /* If rerunning IDARootInit() with the same number of root functions
     (not changing number of gfun components), then check if the root
     function argument has changed */
  /* If g != NULL then return as currently reserved memory resources
     will suffice */
  if (nrt == IDA_mem->ida_nrtfn)
  {
    if (g != IDA_mem->ida_gfun)
    {
      if (g == NULL)
      {
        free(IDA_mem->ida_glo);
        IDA_mem->ida_glo = NULL;
        free(IDA_mem->ida_ghi);
        IDA_mem->ida_ghi = NULL;
        free(IDA_mem->ida_grout);
        IDA_mem->ida_grout = NULL;
        free(IDA_mem->ida_iroots);
        IDA_mem->ida_iroots = NULL;
        free(IDA_mem->ida_rootdir);
        IDA_mem->ida_rootdir = NULL;
        free(IDA_mem->ida_gactive);
        IDA_mem->ida_gactive = NULL;

        IDA_mem->ida_lrw -= 3 * nrt;
        IDA_mem->ida_liw -= 3 * nrt;

        IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ROOT_FUNC_NULL);
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_ILL_INPUT);
      }
      else
      {
        IDA_mem->ida_gfun = g;
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_SUCCESS);
      }
    }
    else
    {
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_SUCCESS);
    }
  }

  /* Set variable values in IDA memory block */
  IDA_mem->ida_nrtfn = nrt;
  if (g == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ROOT_FUNC_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  else { IDA_mem->ida_gfun = g; }

  /* Allocate necessary memory and return */
  IDA_mem->ida_glo = NULL;
  IDA_mem->ida_glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_glo == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_ghi = NULL;
  IDA_mem->ida_ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_ghi == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_grout = NULL;
  IDA_mem->ida_grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (IDA_mem->ida_grout == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_iroots = NULL;
  IDA_mem->ida_iroots = (int*)malloc(nrt * sizeof(int));
  if (IDA_mem->ida_iroots == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_rootdir = NULL;
  IDA_mem->ida_rootdir = (int*)malloc(nrt * sizeof(int));
  if (IDA_mem->ida_rootdir == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  IDA_mem->ida_gactive = NULL;
  IDA_mem->ida_gactive = (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (IDA_mem->ida_gactive == NULL)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { IDA_mem->ida_rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { IDA_mem->ida_gactive[i] = SUNTRUE; }

  IDA_mem->ida_lrw += 3 * nrt;
  IDA_mem->ida_liw += 3 * nrt;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}